

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O0

ImVec2 ImPlot::CalcLegendSize(ImPlotPlot *plot,ImVec2 *pad,ImVec2 *spacing,ImPlotOrientation orn)

{
  int iVar1;
  char *text;
  float fVar2;
  ImVec2 IVar3;
  float local_60;
  float local_5c;
  float label_width;
  char *label;
  float local_40;
  int i;
  float sum_label_width;
  float max_label_width;
  float icon_size;
  float txt_ht;
  int nItems;
  ImPlotOrientation orn_local;
  ImVec2 *spacing_local;
  ImVec2 *pad_local;
  ImPlotPlot *plot_local;
  ImVec2 legend_size;
  
  iVar1 = ImPlotPlot::GetLegendCount(plot);
  fVar2 = ImGui::GetTextLineHeight();
  i = 0;
  local_40 = 0.0;
  for (label._4_4_ = 0; label._4_4_ < iVar1; label._4_4_ = label._4_4_ + 1) {
    text = ImPlotPlot::GetLegendLabel(plot,label._4_4_);
    IVar3 = ImGui::CalcTextSize(text,(char *)0x0,true,-1.0);
    local_5c = IVar3.x;
    if (local_5c <= (float)i) {
      local_60 = (float)i;
    }
    else {
      local_60 = local_5c;
    }
    i = (int)local_60;
    local_40 = local_5c + local_40;
  }
  if (orn == 1) {
    ImVec2::ImVec2((ImVec2 *)&plot_local,pad->x + pad->x + fVar2 + (float)i,
                   (float)(iVar1 + -1) * spacing->y + pad->y + pad->y + (float)iVar1 * fVar2);
  }
  else {
    ImVec2::ImVec2((ImVec2 *)&plot_local,
                   (float)(iVar1 + -1) * spacing->x +
                   pad->x + pad->x + fVar2 * (float)iVar1 + local_40,pad->y + pad->y + fVar2);
  }
  return (ImVec2)plot_local;
}

Assistant:

ImVec2 CalcLegendSize(ImPlotPlot& plot, const ImVec2& pad, const ImVec2& spacing, ImPlotOrientation orn) {
    // vars
    const int   nItems      = plot.GetLegendCount();
    const float txt_ht      = ImGui::GetTextLineHeight();
    const float icon_size   = txt_ht;
    // get label max width
    float max_label_width = 0;
    float sum_label_width = 0;
    for (int i = 0; i < nItems; ++i) {
        const char* label       = plot.GetLegendLabel(i);
        const float label_width = ImGui::CalcTextSize(label, NULL, true).x;
        max_label_width         = label_width > max_label_width ? label_width : max_label_width;
        sum_label_width        += label_width;
    }
    // calc legend size
    const ImVec2 legend_size = orn == ImPlotOrientation_Vertical ?
                               ImVec2(pad.x * 2 + icon_size + max_label_width, pad.y * 2 + nItems * txt_ht + (nItems - 1) * spacing.y) :
                               ImVec2(pad.x * 2 + icon_size * nItems + sum_label_width + (nItems - 1) * spacing.x, pad.y * 2 + txt_ht);
    return legend_size;
}